

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_sub.cpp
# Opt level: O3

long __thiscall
duckdb::DateSubTernaryOperator::Operation<duckdb::string_t,duckdb::date_t,duckdb::date_t,long>
          (DateSubTernaryOperator *this,string_t part,date_t startdate,date_t enddate,
          ValidityMask *mask,idx_t idx)

{
  byte bVar1;
  _Head_base<0UL,_unsigned_long_*,_false> *p_Var2;
  _Alloc_hider _Var3;
  size_type sVar4;
  bool bVar5;
  DatePartSpecifier DVar6;
  int64_t iVar7;
  TemplatedValidityData<unsigned_long> *pTVar8;
  _Head_base<0UL,_unsigned_long_*,_false> _Var9;
  NotImplementedException *this_00;
  date_t input;
  undefined4 in_register_00000084;
  long lVar10;
  string local_88;
  undefined8 local_60;
  long local_58;
  string local_50;
  
  p_Var2 = (_Head_base<0UL,_unsigned_long_*,_false> *)CONCAT44(in_register_00000084,enddate.days);
  input.days = part.value._8_4_;
  local_60 = this;
  local_58 = part.value._0_8_;
  bVar5 = Value::IsFinite<duckdb::date_t>(input);
  if ((bVar5) && (bVar5 = Value::IsFinite<duckdb::date_t>(startdate), bVar5)) {
    lVar10 = part.value._0_8_;
    if ((uint)this < 0xd) {
      lVar10 = (long)&local_60 + 4;
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,lVar10,((ulong)this & 0xffffffff) + lVar10);
    DVar6 = GetDatePartSpecifier(&local_50);
    switch(DVar6) {
    case BEGIN_BIGINT:
    case ISOYEAR:
      iVar7 = DateSub::YearOperator::Operation<duckdb::date_t,duckdb::date_t,long>(input,startdate);
      break;
    case MONTH:
      iVar7 = DateSub::MonthOperator::Operation<duckdb::date_t,duckdb::date_t,long>(input,startdate)
      ;
      break;
    case DAY:
    case DOW:
    case ISODOW:
    case DOY:
    case JULIAN_DAY:
      iVar7 = DateSub::DayOperator::Operation<duckdb::date_t,duckdb::date_t,long>(input,startdate);
      break;
    case DECADE:
      iVar7 = DateSub::DecadeOperator::Operation<duckdb::date_t,duckdb::date_t,long>
                        (input,startdate);
      break;
    case CENTURY:
      iVar7 = DateSub::CenturyOperator::Operation<duckdb::date_t,duckdb::date_t,long>
                        (input,startdate);
      break;
    case MILLENNIUM:
      iVar7 = DateSub::MilleniumOperator::Operation<duckdb::date_t,duckdb::date_t,long>
                        (input,startdate);
      break;
    case MICROSECONDS:
      iVar7 = DateSub::MicrosecondsOperator::Operation<duckdb::date_t,duckdb::date_t,long>
                        (input,startdate);
      break;
    case MILLISECONDS:
      iVar7 = DateSub::MillisecondsOperator::Operation<duckdb::date_t,duckdb::date_t,long>
                        (input,startdate);
      break;
    case SECOND:
    case BEGIN_DOUBLE:
      iVar7 = DateSub::SecondsOperator::Operation<duckdb::date_t,duckdb::date_t,long>
                        (input,startdate);
      break;
    case MINUTE:
      iVar7 = DateSub::MinutesOperator::Operation<duckdb::date_t,duckdb::date_t,long>
                        (input,startdate);
      break;
    case HOUR:
      iVar7 = DateSub::HoursOperator::Operation<duckdb::date_t,duckdb::date_t,long>(input,startdate)
      ;
      break;
    case WEEK:
    case YEARWEEK:
      iVar7 = DateSub::WeekOperator::Operation<duckdb::date_t,duckdb::date_t,long>(input,startdate);
      break;
    case QUARTER:
      iVar7 = DateSub::QuarterOperator::Operation<duckdb::date_t,duckdb::date_t,long>
                        (input,startdate);
      break;
    default:
      this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"Specifier type not implemented for DATESUB","");
      NotImplementedException::NotImplementedException(this_00,&local_88);
      __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  else {
    _Var9._M_head_impl = p_Var2->_M_head_impl;
    if (_Var9._M_head_impl == (unsigned_long *)0x0) {
      local_50._M_dataplus._M_p = (pointer)p_Var2[3]._M_head_impl;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                ((duckdb *)&local_88,(unsigned_long *)&local_50);
      sVar4 = local_88._M_string_length;
      _Var3._M_p = local_88._M_dataplus._M_p;
      local_88._M_dataplus._M_p = (pointer)0x0;
      local_88._M_string_length = 0;
      _Var9._M_head_impl = p_Var2[2]._M_head_impl;
      p_Var2[1]._M_head_impl = (unsigned_long *)_Var3._M_p;
      p_Var2[2]._M_head_impl = (unsigned_long *)sVar4;
      if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var9._M_head_impl !=
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var9._M_head_impl),
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_string_length !=
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_string_length);
      }
      pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                          (p_Var2 + 1));
      _Var9._M_head_impl =
           (pTVar8->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
      p_Var2->_M_head_impl = _Var9._M_head_impl;
    }
    bVar1 = (byte)mask & 0x3f;
    _Var9._M_head_impl[(ulong)mask >> 6] =
         _Var9._M_head_impl[(ulong)mask >> 6] & (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1)
    ;
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

static inline TR Operation(TS part, TA startdate, TB enddate, ValidityMask &mask, idx_t idx) {
		if (Value::IsFinite(startdate) && Value::IsFinite(enddate)) {
			return SubtractDateParts<TA, TB, TR>(GetDatePartSpecifier(part.GetString()), startdate, enddate);
		} else {
			mask.SetInvalid(idx);
			return TR();
		}
	}